

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDDMAP mtbdd_map_update(MTBDDMAP map1,MTBDDMAP map2)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  MTBDDMAP MVar5;
  MTBDD MVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  MVar5 = map2;
  if ((map1 != 0) && (MVar5 = map1, map2 != 0)) {
    puVar1 = nodes->data;
    lVar9 = (map1 & 0xffffffffff) * 0x10;
    lVar8 = (map2 & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar9 + 8);
    uVar3 = *(ulong *)(puVar1 + lVar8 + 8);
    uVar4 = (uint)(uVar2 >> 0x20);
    uVar7 = uVar4 >> 8;
    if (uVar2 >> 0x28 < uVar3 >> 0x28) {
      MVar5 = mtbdd_map_update(uVar2 & 0xffffffffff | map1 & 0x8000000000000000,map2);
      MVar6 = *(ulong *)(puVar1 + lVar9) & 0x800000ffffffffff ^ map1 & 0x8000000000000000;
    }
    else {
      uVar4 = (uint)(uVar3 >> 0x20);
      if (uVar7 <= uVar4 >> 8) {
        map1 = map1 & 0x8000000000000000 | uVar2 & 0xffffffffff;
      }
      MVar5 = mtbdd_map_update(map1,uVar3 & 0xffffffffff | map2 & 0x8000000000000000);
      MVar6 = *(ulong *)(puVar1 + lVar8) & 0x800000ffffffffff ^ map2 & 0x8000000000000000;
    }
    MVar6 = mtbdd_makemapnode(uVar4 >> 8,MVar5,MVar6);
    return MVar6;
  }
  return MVar5;
}

Assistant:

MTBDDMAP
mtbdd_map_update(MTBDDMAP map1, MTBDDMAP map2)
{
    if (mtbdd_map_isempty(map1)) return map2;
    if (mtbdd_map_isempty(map2)) return map1;

    mtbddnode_t n1 = MTBDD_GETNODE(map1);
    mtbddnode_t n2 = MTBDD_GETNODE(map2);
    uint32_t k1 = mtbddnode_getvariable(n1);
    uint32_t k2 = mtbddnode_getvariable(n2);

    MTBDDMAP result;
    if (k1 < k2) {
        MTBDDMAP low = mtbdd_map_update(node_getlow(map1, n1), map2);
        result = mtbdd_makemapnode(k1, low, node_gethigh(map1, n1));
    } else if (k1 > k2) {
        MTBDDMAP low = mtbdd_map_update(map1, node_getlow(map2, n2));
        result = mtbdd_makemapnode(k2, low, node_gethigh(map2, n2));
    } else {
        MTBDDMAP low = mtbdd_map_update(node_getlow(map1, n1), node_getlow(map2, n2));
        result = mtbdd_makemapnode(k2, low, node_gethigh(map2, n2));
    }

    return result;
}